

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

UObject * __thiscall
icu_63::SimpleFactory::create
          (SimpleFactory *this,ICUServiceKey *key,ICUService *service,UErrorCode *status)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int32_t iVar5;
  bool bVar6;
  UnicodeString temp;
  UnicodeString local_50;
  UnicodeString *text;
  
  if (U_ZERO_ERROR < *status) {
    return (UObject *)0x0;
  }
  local_50.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_50.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar4 = (*(key->super_UObject)._vptr_UObject[5])(key,&local_50);
  text = (UnicodeString *)CONCAT44(extraout_var,iVar4);
  uVar1 = (this->_id).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar4 = (this->_id).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)(short)uVar1 >> 5;
    }
    sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar5 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    if ((((int)sVar2 & 1U) != 0) || (iVar4 != iVar5)) goto LAB_0029c29e;
    UVar3 = UnicodeString::doEquals(&this->_id,text,iVar4);
    bVar6 = UVar3 != '\0';
  }
  else {
    bVar6 = (bool)(*(byte *)&text->fUnion & 1);
  }
  if (bVar6 != false) {
    iVar4 = (*(service->super_ICUNotifier)._vptr_ICUNotifier[0xe])(service,this->_instance);
    UnicodeString::~UnicodeString(&local_50);
    return (UObject *)CONCAT44(extraout_var_00,iVar4);
  }
LAB_0029c29e:
  UnicodeString::~UnicodeString(&local_50);
  return (UObject *)0x0;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result) const 
{
    return getDisplayName(id, result, Locale::getDefault());
}